

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

void uprv_getStaticCurrencyName_63(UChar *iso,char *loc,UnicodeString *result,UErrorCode *ec)

{
  UBool UVar1;
  UChar *srcChars;
  UChar *currname;
  int32_t len;
  UBool isChoiceFormat;
  UErrorCode *ec_local;
  UnicodeString *result_local;
  char *loc_local;
  UChar *iso_local;
  
  _len = ec;
  ec_local = (UErrorCode *)result;
  result_local = (UnicodeString *)loc;
  loc_local = (char *)iso;
  srcChars = ucurr_getName_63(iso,loc,UCURR_SYMBOL_NAME,(UBool *)((long)&currname + 7),
                              (int32_t *)&currname,ec);
  UVar1 = U_SUCCESS(*_len);
  if (UVar1 != '\0') {
    icu_63::UnicodeString::setTo((UnicodeString *)ec_local,srcChars,(int32_t)currname);
  }
  return;
}

Assistant:

U_CAPI void
uprv_getStaticCurrencyName(const UChar* iso, const char* loc,
                           icu::UnicodeString& result, UErrorCode& ec)
{
    U_NAMESPACE_USE

    UBool isChoiceFormat;
    int32_t len;
    const UChar* currname = ucurr_getName(iso, loc, UCURR_SYMBOL_NAME,
                                          &isChoiceFormat, &len, &ec);
    if (U_SUCCESS(ec)) {
        result.setTo(currname, len);
    }
}